

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

string * __thiscall
phosg::string_vprintf_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,char *fmt,__va_list_tag *va)

{
  int iVar1;
  undefined8 *puVar2;
  char *result;
  char *local_18;
  
  local_18 = (char *)0x0;
  iVar1 = vasprintf(&local_18,(char *)this,fmt);
  if (local_18 != (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_18,local_18 + iVar1);
    free(local_18);
    return __return_storage_ptr__;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = dup2;
  __cxa_throw(puVar2,&::std::bad_alloc::typeinfo,::std::bad_alloc::~bad_alloc);
}

Assistant:

string string_vprintf(const char* fmt, va_list va) {
#ifndef PHOSG_WINDOWS
  char* result = nullptr;
  int length = vasprintf(&result, fmt, va);

  if (result == nullptr) {
    throw bad_alloc();
  }

  string ret(result, length);
  free(result);

#else
  string ret(0x400, '\0');
  int size = vsnprintf(ret.data(), ret.size(), fmt, va);
  // TODO: We probably can handle this case more gracefully. Really, we should
  // just restart va, resize the string, and call vsnprintf again, but I'm too
  // lazy to test/verify that this works (or that va doesn't need restarting)
  if (size > 0x400) {
    throw logic_error("size too long");
  }
  ret.resize(size);

#endif
  return ret;
}